

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interact.cc
# Opt level: O1

void predict_or_learn<true,true>(interact *in,single_learner *base,example *ec)

{
  uchar **ppuVar1;
  byte bVar2;
  byte bVar3;
  uchar *puVar4;
  bool bVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  features *f_src2;
  ulong uVar9;
  long lVar10;
  features *f_src1;
  float fVar11;
  
  bVar2 = in->n1;
  f_src1 = (ec->super_example_predict).feature_space + bVar2;
  bVar3 = in->n2;
  f_src2 = (ec->super_example_predict).feature_space + bVar3;
  bVar5 = contains_valid_namespaces(in->all,f_src1,f_src2,in);
  if (!bVar5) {
    (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
    return;
  }
  in->num_features = ec->num_features;
  in->total_sum_feat_sq = ec->total_sum_feat_sq;
  fVar11 = ec->total_sum_feat_sq - (ec->super_example_predict).feature_space[bVar2].sum_feat_sq;
  ec->total_sum_feat_sq = fVar11;
  ec->total_sum_feat_sq = fVar11 - (ec->super_example_predict).feature_space[bVar3].sum_feat_sq;
  sVar6 = ec->num_features -
          ((long)(ec->super_example_predict).feature_space[bVar2].values._end -
           (long)(f_src1->values)._begin >> 2);
  ec->num_features = sVar6;
  ec->num_features =
       sVar6 - ((long)(ec->super_example_predict).feature_space[bVar3].values._end -
                (long)(f_src2->values)._begin >> 2);
  features::deep_copy_from(&in->feat_store,f_src1);
  multiply(f_src1,f_src2,in);
  ec->total_sum_feat_sq =
       (ec->super_example_predict).feature_space[bVar2].sum_feat_sq + ec->total_sum_feat_sq;
  ec->num_features =
       ec->num_features +
       ((long)(ec->super_example_predict).feature_space[bVar2].values._end -
        (long)(f_src1->values)._begin >> 2);
  puVar4 = (ec->super_example_predict).indices._begin;
  lVar8 = (long)(ec->super_example_predict).indices._end - (long)puVar4;
  if (lVar8 != 0) {
    lVar7 = 0;
    lVar10 = 0;
    do {
      if (puVar4[lVar10] == in->n2) {
        uVar9 = -lVar7 >> 0x20;
        memmove(puVar4 + uVar9,puVar4 + (0x100000000 - lVar7 >> 0x20),lVar8 + ~uVar9);
        ppuVar1 = &(ec->super_example_predict).indices._end;
        *ppuVar1 = *ppuVar1 + -1;
        goto LAB_001f8bdb;
      }
      lVar10 = lVar10 + 1;
      lVar7 = lVar7 + -0x100000000;
    } while (lVar8 != lVar10);
  }
  uVar9 = 0xffffffffffffffff;
LAB_001f8bdb:
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  v_array<unsigned_char>::incr((v_array<unsigned_char> *)ec);
  puVar4 = (ec->super_example_predict).indices._begin;
  memmove(puVar4 + uVar9 + 1,puVar4 + uVar9,
          (size_t)((ec->super_example_predict).indices._end + (~uVar9 - (long)puVar4)));
  (ec->super_example_predict).indices._begin[uVar9] = in->n2;
  features::deep_copy_from(f_src1,&in->feat_store);
  ec->total_sum_feat_sq = in->total_sum_feat_sq;
  ec->num_features = in->num_features;
  return;
}

Assistant:

void predict_or_learn(interact& in, LEARNER::single_learner& base, example& ec)
{
  features& f1 = ec.feature_space[in.n1];
  features& f2 = ec.feature_space[in.n2];

  if (!contains_valid_namespaces(*in.all, f1, f2, in))
  {
    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    return;
  }

  in.num_features = ec.num_features;
  in.total_sum_feat_sq = ec.total_sum_feat_sq;
  ec.total_sum_feat_sq -= f1.sum_feat_sq;
  ec.total_sum_feat_sq -= f2.sum_feat_sq;
  ec.num_features -= f1.size();
  ec.num_features -= f2.size();

  in.feat_store.deep_copy_from(f1);

  multiply(f1, f2, in);
  ec.total_sum_feat_sq += f1.sum_feat_sq;
  ec.num_features += f1.size();

  /*for(uint64_t i = 0;i < f1.size();i++)
    cout<<f1[i].weight_index<<":"<<f1[i].x<<" ";
    cout<<endl;*/

  // remove 2nd namespace
  int n2_i = -1;
  for (size_t i = 0; i < ec.indices.size(); i++)
  {
    if (ec.indices[i] == in.n2)
    {
      n2_i = (int)i;
      memmove(&ec.indices[n2_i], &ec.indices[n2_i + 1], sizeof(unsigned char) * (ec.indices.size() - n2_i - 1));
      ec.indices.decr();
      break;
    }
  }

  base.predict(ec);
  if (is_learn)
    base.learn(ec);

  // re-insert namespace into the right position
  ec.indices.incr();
  memmove(&ec.indices[n2_i + 1], &ec.indices[n2_i], sizeof(unsigned char) * (ec.indices.size() - n2_i - 1));
  ec.indices[n2_i] = in.n2;

  f1.deep_copy_from(in.feat_store);
  ec.total_sum_feat_sq = in.total_sum_feat_sq;
  ec.num_features = in.num_features;
}